

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing.cpp
# Opt level: O0

void __thiscall wasm::UniqueNameMapper::popLabelName(UniqueNameMapper *this,Name name)

{
  bool bVar1;
  IString *this_00;
  mapped_type *__k;
  mapped_type *this_01;
  UniqueNameMapper *this_local;
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  this_local = name.super_IString.str._M_len;
  this_00 = &std::vector<wasm::Name,_std::allocator<wasm::Name>_>::back(&this->labelStack)->
             super_IString;
  bVar1 = IString::operator==(this_00,(IString *)&this_local);
  if (!bVar1) {
    __assert_fail("labelStack.back() == name",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/parsing.cpp"
                  ,0x4a,"void wasm::UniqueNameMapper::popLabelName(Name)");
  }
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::pop_back(&this->labelStack);
  __k = std::
        map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
        ::operator[](&this->reverseLabelMapping,(key_type *)&this_local);
  this_01 = std::
            map<wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
            ::operator[](&this->labelMappings,__k);
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::pop_back(this_01);
  return;
}

Assistant:

void UniqueNameMapper::popLabelName(Name name) {
  assert(labelStack.back() == name);
  labelStack.pop_back();
  labelMappings[reverseLabelMapping[name]].pop_back();
}